

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void xm_create_context_from_libxmize(xm_context_t **ctxp,char *libxmized,uint32_t rate)

{
  xm_instrument_t **ppxVar1;
  uint8_t **ppuVar2;
  xm_channel_context_t **ppxVar3;
  long *plVar4;
  char *pcVar5;
  short *psVar6;
  anon_union_8_2_8127e1e2_for_xm_sample_s_11 *paVar7;
  xm_sample_t **ppxVar8;
  xm_instrument_t *pxVar9;
  int8_t *piVar10;
  xm_context_t *pxVar11;
  long lVar12;
  ulong uVar13;
  size_t k;
  ulong uVar14;
  ulong uVar15;
  size_t k_1;
  ulong uVar16;
  xm_sample_t *pxVar17;
  
  *ctxp = (xm_context_t *)libxmized;
  *(char **)(libxmized + 0x118) = libxmized + *(long *)(libxmized + 0x118);
  ppxVar1 = &((*ctxp)->module).instruments;
  *ppxVar1 = (xm_instrument_t *)
             (((*ctxp)->module).pattern_table + (long)((*ppxVar1)->sample_of_notes + -10) + -0x10);
  ppuVar2 = &(*ctxp)->row_loop_count;
  *ppuVar2 = *ppuVar2 + (long)*ctxp;
  ppxVar3 = &(*ctxp)->channels;
  *ppxVar3 = (xm_channel_context_t *)
             (((*ctxp)->module).pattern_table + (long)((*ppxVar3)[-1].actual_volume + -4));
  lVar12 = 8;
  for (uVar13 = 0; pxVar11 = *ctxp, uVar13 < (pxVar11->module).num_patterns; uVar13 = uVar13 + 1) {
    plVar4 = (long *)((long)&((pxVar11->module).patterns)->num_rows + lVar12);
    *plVar4 = (long)((pxVar11->module).pattern_table + *plVar4 + -0x18);
    lVar12 = lVar12 + 0x10;
  }
  for (uVar13 = 0; uVar13 < (pxVar11->module).num_instruments; uVar13 = uVar13 + 1) {
    ppxVar8 = &(pxVar11->module).instruments[uVar13].samples;
    *ppxVar8 = (xm_sample_t *)((pxVar11->module).pattern_table + (long)&(*ppxVar8)[-1].panning);
    pxVar11 = *ctxp;
    for (uVar15 = 0; pxVar9 = (pxVar11->module).instruments, uVar15 < pxVar9[uVar13].num_samples;
        uVar15 = uVar15 + 1) {
      paVar7 = &pxVar9[uVar13].samples[uVar15].field_11;
      paVar7->data8 = paVar7->data8 + (long)pxVar11;
      pxVar11 = *ctxp;
      pxVar17 = (pxVar11->module).instruments[uVar13].samples;
      uVar16 = (ulong)pxVar17[uVar15].length;
      if (1 < uVar16) {
        if (pxVar17[uVar15].bits == '\b') {
          for (uVar14 = 1; uVar14 < uVar16; uVar14 = uVar14 + 1) {
            pcVar5 = pxVar17[uVar15].field_11.data8 + uVar14;
            *pcVar5 = *pcVar5 + pxVar17[uVar15].field_11.data8[uVar14 - 1];
            pxVar11 = *ctxp;
            pxVar17 = (pxVar11->module).instruments[uVar13].samples;
            uVar16 = (ulong)pxVar17[uVar15].length;
          }
        }
        else {
          for (uVar14 = 1; uVar16 != uVar14; uVar14 = uVar14 + 1) {
            piVar10 = pxVar17[uVar15].field_11.data8;
            psVar6 = (short *)(piVar10 + uVar14 * 2);
            *psVar6 = *psVar6 + *(short *)(piVar10 + uVar14 * 2 + -2);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void xm_create_context_from_libxmize(xm_context_t** ctxp, char* libxmized, uint32_t rate) {
	size_t i, j;

	*ctxp = (void*)libxmized;

	/* Reverse steps of libxmize.c */
	OFFSET((*ctxp)->module.patterns);
	OFFSET((*ctxp)->module.instruments);
	OFFSET((*ctxp)->row_loop_count);
	OFFSET((*ctxp)->channels);

	for(i = 0; i < (*ctxp)->module.num_patterns; ++i) {
		OFFSET((*ctxp)->module.patterns[i].slots);
	}

	for(i = 0; i < (*ctxp)->module.num_instruments; ++i) {
		OFFSET((*ctxp)->module.instruments[i].samples);

		for(j = 0; j < (*ctxp)->module.instruments[i].num_samples; ++j) {
			OFFSET((*ctxp)->module.instruments[i].samples[j].data8);

			if(XM_LIBXMIZE_DELTA_SAMPLES) {
				if((*ctxp)->module.instruments[i].samples[j].length > 1) {
					if((*ctxp)->module.instruments[i].samples[j].bits == 8) {
						for(size_t k = 1; k < (*ctxp)->module.instruments[i].samples[j].length; ++k) {
							(*ctxp)->module.instruments[i].samples[j].data8[k] += (*ctxp)->module.instruments[i].samples[j].data8[k-1];
						}
					} else {
						for(size_t k = 1; k < (*ctxp)->module.instruments[i].samples[j].length; ++k) {
							(*ctxp)->module.instruments[i].samples[j].data16[k] += (*ctxp)->module.instruments[i].samples[j].data16[k-1];
						}
					}
				}
			}
		}
	}
}